

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

ON_Interval ApproxSpectrumLTL(ON_Xform *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int j;
  long lVar6;
  long lVar7;
  double *this;
  double *pdVar8;
  ON_Xform *pOVar9;
  double *pdVar10;
  int i;
  byte bVar11;
  double dVar12;
  ON_Interval OVar13;
  ON_Interval local_138;
  ON_Interval SpectrumHull;
  ON_Xform LTL;
  
  bVar11 = 0;
  this = (double *)&LTL;
  lVar7 = 0x10;
  pdVar8 = (double *)L;
  pdVar10 = this;
  for (lVar6 = lVar7; dVar5 = LTL.m_xform[2][3], dVar4 = LTL.m_xform[1][3],
      dVar3 = LTL.m_xform[1][2], dVar2 = LTL.m_xform[0][3], dVar1 = LTL.m_xform[0][2],
      dVar12 = LTL.m_xform[0][1], lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar10 = *pdVar8;
    pdVar8 = pdVar8 + 1;
    pdVar10 = pdVar10 + 1;
  }
  LTL.m_xform[0][1] = LTL.m_xform[1][0];
  LTL.m_xform[1][0] = dVar12;
  LTL.m_xform[0][2] = LTL.m_xform[2][0];
  LTL.m_xform[2][0] = dVar1;
  LTL.m_xform[0][3] = LTL.m_xform[3][0];
  LTL.m_xform[3][0] = dVar2;
  LTL.m_xform[1][2] = LTL.m_xform[2][1];
  LTL.m_xform[2][1] = dVar3;
  LTL.m_xform[1][3] = LTL.m_xform[3][1];
  LTL.m_xform[3][1] = dVar4;
  LTL.m_xform[2][3] = LTL.m_xform[3][2];
  LTL.m_xform[3][2] = dVar5;
  ON_Xform::operator*((ON_Xform *)&SpectrumHull,(ON_Xform *)this,L);
  pOVar9 = (ON_Xform *)&SpectrumHull;
  pdVar8 = this;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar8 = pOVar9->m_xform[0][0];
    pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pdVar8 = pdVar8 + (ulong)bVar11 * -2 + 1;
  }
  ON_Interval::ON_Interval(&SpectrumHull);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    dVar12 = 0.0;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      if (lVar7 != lVar6) {
        dVar12 = dVar12 + ABS(this[lVar6]);
      }
    }
    dVar1 = *(double *)((long)LTL.m_xform + lVar7 * 0x28);
    ON_Interval::ON_Interval(&local_138,dVar1 - dVar12,dVar12 + dVar1);
    if (lVar7 == 0) {
      SpectrumHull.m_t[0] = local_138.m_t[0];
      SpectrumHull.m_t[1] = local_138.m_t[1];
    }
    else {
      ON_Interval::Union(&SpectrumHull,&local_138);
    }
    this = this + 4;
  }
  OVar13.m_t[0] = SpectrumHull.m_t[0];
  OVar13.m_t[1] = SpectrumHull.m_t[1];
  return (ON_Interval)OVar13.m_t;
}

Assistant:

static ON_Interval ApproxSpectrumLTL(const ON_Xform& L)
{
	// L.IsLinear() is a precondition

	// LTL = L^T * L
	ON_Xform LTL = L;
	LTL.Transpose();
	LTL = LTL * L;

	return  BoundEVals(LTL);
}